

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O0

void __thiscall
unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
          (detail *this,ostream *os,span<const_std::byte,_18446744073709551615UL> key)

{
  size_type sVar1;
  ostream *poVar2;
  reference peVar3;
  size_type local_30;
  size_t i;
  size_type sz;
  ostream *os_local;
  span<const_std::byte,_18446744073709551615UL> key_local;
  
  key_local._M_ptr = key._M_ptr;
  os_local = os;
  sVar1 = std::span<const_std::byte,_18446744073709551615UL>::size_bytes
                    ((span<const_std::byte,_18446744073709551615UL> *)&os_local);
  poVar2 = std::operator<<((ostream *)this,"key(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar1);
  std::operator<<(poVar2,"): 0x");
  for (local_30 = 0; local_30 < sVar1; local_30 = local_30 + 1) {
    peVar3 = std::span<const_std::byte,_18446744073709551615UL>::operator[]
                       ((span<const_std::byte,_18446744073709551615UL> *)&os_local,local_30);
    dump_byte((ostream *)this,*peVar3);
  }
  return;
}

Assistant:

[[gnu::cold]] void dump_key(std::ostream &os, T key) {
  if constexpr (std::is_same_v<T, key_view>) {
    const auto sz = key.size_bytes();
    os << "key(" << sz << "): 0x";
    for (std::size_t i = 0; i < sz; ++i) unodb::detail::dump_byte(os, key[i]);
  } else {
    os << "key: 0x" << std::hex << std::setfill('0') << std::setw(sizeof(key))
       << key << std::dec;
  }
}